

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_cfilter_remove(Curl_easy *data,int sockindex,_Bool send_shutdown)

{
  Curl_cfilter *local_38;
  _Bool local_2d;
  CURLcode local_2c;
  _Bool done;
  Curl_cfilter *pCStack_28;
  CURLcode result;
  Curl_cfilter *head;
  Curl_cfilter *cf;
  _Bool send_shutdown_local;
  Curl_easy *pCStack_10;
  int sockindex_local;
  Curl_easy *data_local;
  
  local_2c = 0;
  if (data->conn == (connectdata *)0x0) {
    local_38 = (Curl_cfilter *)0x0;
  }
  else {
    local_38 = data->conn->cfilter[sockindex];
  }
  pCStack_28 = local_38;
  head = local_38;
  while( true ) {
    if (head == (Curl_cfilter *)0x0) {
      return CURLE_OK;
    }
    if (head->cft == &Curl_cft_ssl) break;
    head = head->next;
  }
  cf._3_1_ = send_shutdown;
  cf._4_4_ = sockindex;
  pCStack_10 = data;
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     ((head != (Curl_cfilter *)0x0 && (0 < head->cft->log_level)))) {
    Curl_trc_cf_infof(data,head,"shutdown and remove SSL, start");
  }
  Curl_shutdown_start(pCStack_10,cf._4_4_,0,(curltime *)0x0);
  local_2c = vtls_shutdown_blocking(head,pCStack_10,(_Bool)(cf._3_1_ & 1),&local_2d);
  Curl_shutdown_clear(pCStack_10,cf._4_4_);
  if ((local_2c == CURLE_OK) && ((local_2d & 1U) == 0)) {
    local_2c = CURLE_SSL_SHUTDOWN_FAILED;
  }
  Curl_conn_cf_discard_sub(pCStack_28,head,pCStack_10,false);
  if (pCStack_10 == (Curl_easy *)0x0) {
    return local_2c;
  }
  if ((*(ulong *)&(pCStack_10->set).field_0x89c >> 0x1e & 1) == 0) {
    return local_2c;
  }
  if (((pCStack_10->state).feat != (curl_trc_feat *)0x0) &&
     (((pCStack_10->state).feat)->log_level < 1)) {
    return local_2c;
  }
  if (head == (Curl_cfilter *)0x0) {
    return local_2c;
  }
  if (head->cft->log_level < 1) {
    return local_2c;
  }
  Curl_trc_cf_infof(pCStack_10,head,"shutdown and remove SSL, done -> %d",(ulong)local_2c);
  return local_2c;
}

Assistant:

CURLcode Curl_ssl_cfilter_remove(struct Curl_easy *data,
                                 int sockindex, bool send_shutdown)
{
  struct Curl_cfilter *cf, *head;
  CURLcode result = CURLE_OK;

  head = data->conn ? data->conn->cfilter[sockindex] : NULL;
  for(cf = head; cf; cf = cf->next) {
    if(cf->cft == &Curl_cft_ssl) {
      bool done;
      CURL_TRC_CF(data, cf, "shutdown and remove SSL, start");
      Curl_shutdown_start(data, sockindex, 0, NULL);
      result = vtls_shutdown_blocking(cf, data, send_shutdown, &done);
      Curl_shutdown_clear(data, sockindex);
      if(!result && !done) /* blocking failed? */
        result = CURLE_SSL_SHUTDOWN_FAILED;
      Curl_conn_cf_discard_sub(head, cf, data, FALSE);
      CURL_TRC_CF(data, cf, "shutdown and remove SSL, done -> %d", result);
      break;
    }
  }
  return result;
}